

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

int Lpk_CountSupp(Abc_Ntk_t *p,Vec_Ptr_t *vNodes)

{
  uint *puVar1;
  long *plVar2;
  Abc_Obj_t *p_00;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (vNodes->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    do {
      plVar2 = (long *)vNodes->pArray[lVar6];
      if (0 < *(int *)((long)plVar2 + 0x1c)) {
        lVar5 = 0;
        do {
          p_00 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                  (long)*(int *)(plVar2[4] + lVar5 * 4) * 8);
          iVar3 = Abc_NodeIsTravIdCurrent(p_00);
          if (iVar3 == 0) {
            iVar4 = (iVar4 + 1) - (uint)((*(uint *)&p_00->field_0x14 >> 9 & 1) != 0);
            *(uint *)&p_00->field_0x14 = *(uint *)&p_00->field_0x14 | 0x200;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar6 = 0;
    do {
      plVar2 = (long *)vNodes->pArray[lVar6];
      if (0 < *(int *)((long)plVar2 + 0x1c)) {
        lVar5 = 0;
        do {
          puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)(plVar2[4] + lVar5 * 4) * 8) + 0x14);
          *puVar1 = *puVar1 & 0xfffffdff;
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  return iVar4;
}

Assistant:

int Lpk_CountSupp( Abc_Ntk_t * p, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pObj, * pFanin; 
    int i, k, Count = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            Count += !pFanin->fPersist;
            pFanin->fPersist = 1;
        }
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pFanin->fPersist = 0;
    return Count;
}